

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadTorus>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadTorus> *this,int64_t id,TPZVec<long> *nodeindexes,
          int matind,TPZGeoMesh *mesh)

{
  TPZGeoEl *in_RDI;
  int i;
  TPZGeoMesh *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  int64_t in_stack_ffffffffffffff60;
  void **in_stack_ffffffffffffff68;
  TPZCompEl **ppTVar1;
  TPZGeoEl *in_stack_ffffffffffffff70;
  TPZVec<long> *in_stack_ffffffffffffff78;
  int *piVar2;
  TPZQuadTorus *in_stack_ffffffffffffff80;
  TPZGeoElSideIndex local_60;
  int local_48;
  undefined8 local_38;
  undefined8 local_30;
  
  local_30 = 0;
  local_38 = 0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZQuadTorus>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_0245e290);
  TPZGeoEl::TPZGeoEl(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_0245df78;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_0245df78;
  pzgeom::TPZQuadTorus::TPZQuadTorus(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  ppTVar1 = &in_RDI[7].fReference;
  piVar2 = &in_RDI[10].fNumInterfaces;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex((TPZGeoElSideIndex *)in_stack_ffffffffffffff50);
    ppTVar1 = ppTVar1 + 3;
  } while (ppTVar1 != (TPZCompEl **)piVar2);
  for (local_48 = 0; local_48 < 9; local_48 = local_48 + 1) {
    TPZGeoElSideIndex::TPZGeoElSideIndex((TPZGeoElSideIndex *)in_stack_ffffffffffffff50);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(&in_RDI[7].fReference + (long)local_48 * 3),&local_60);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x1714ea8);
  }
  pzgeom::TPZNodeRep<4,_pztopology::TPZQuadrilateral>::Initialize
            ((TPZNodeRep<4,_pztopology::TPZQuadrilateral> *)(in_RDI + 1),in_RDI);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(int64_t id,TPZVec<int64_t> &nodeindexes,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(id,matind,mesh) , fGeo(nodeindexes) {
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}